

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLkParser.cpp
# Opt level: O2

void __thiscall antlr::LLkParser::trace(LLkParser *this,char *ee,char *rname)

{
  ostream *poVar1;
  uint uVar2;
  char *pcVar3;
  TokenRefCount<antlr::Token> local_78;
  string temp;
  string local_50 [32];
  
  (*(this->super_Parser)._vptr_Parser[0x1b])();
  poVar1 = std::operator<<((ostream *)&std::cout,ee);
  poVar1 = std::operator<<(poVar1,rname);
  pcVar3 = "; ";
  if (0 < ((this->super_Parser).inputState.ref)->ptr->guessing) {
    pcVar3 = "; [guessing]";
  }
  std::operator<<(poVar1,pcVar3);
  for (uVar2 = 1; (int)uVar2 <= *(int *)&(this->super_Parser).field_0x1c; uVar2 = uVar2 + 1) {
    if (uVar2 != 1) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"LA(");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,uVar2);
    std::operator<<(poVar1,")==");
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    (*(this->super_Parser)._vptr_Parser[3])(&local_78,this,(ulong)uVar2);
    (*(local_78.ref)->ptr->_vptr_Token[4])(local_50);
    std::__cxx11::string::assign((char *)&temp);
    std::__cxx11::string::~string(local_50);
    TokenRefCount<antlr::Token>::~TokenRefCount(&local_78);
    std::operator<<((ostream *)&std::cout,(string *)&temp);
    std::__cxx11::string::~string((string *)&temp);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void LLkParser::trace(const char* ee, const char* rname)
{
	traceIndent();

	cout << ee << rname << ((inputState->guessing>0)?"; [guessing]":"; ");

	for (int i = 1; i <= k; i++)
	{
		if (i != 1) {
			cout << ", ";
		}
		cout << "LA(" << i << ")==";

		string temp;

		try {
			temp = LT(i)->getText().c_str();
		}
		catch( ANTLRException& ae )
		{
			temp = "[error: ";
			temp += ae.toString();
			temp += ']';
		}
		cout << temp;
	}

	cout << endl;
}